

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *p,int iNode)

{
  Vec_Int_t *p_00;
  long lVar1;
  uint uVar2;
  int *piVar3;
  word *pwVar4;
  int iVar5;
  int iVar6;
  word wVar7;
  void **ppvVar8;
  ulong uVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int local_5c;
  
  piVar3 = (p->vRefs).pArray;
  wVar7 = Gia_Rsb2ManOdcs(p,iNode);
  p->CareSet = wVar7;
  if ((iNode < 0) || ((p->vSims).nSize <= iNode * 2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                  ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  uVar9 = (p->vSims).pArray[(uint)(iNode * 2)] & wVar7;
  p->Truth1 = uVar9;
  p->Truth0 = uVar9 ^ wVar7;
  (p->vpDivs).nSize = 0;
  if ((p->vpDivs).nCap == 0) {
    ppvVar8 = (p->vpDivs).pArray;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x80);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x80);
    }
    (p->vpDivs).pArray = ppvVar8;
    (p->vpDivs).nCap = 0x10;
  }
  iVar5 = (p->vpDivs).nSize;
  uVar10 = iVar5 + 1;
  (p->vpDivs).nSize = uVar10;
  (p->vpDivs).pArray[iVar5] = &p->Truth0;
  uVar2 = (p->vpDivs).nCap;
  if (uVar10 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar8 = (p->vpDivs).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_007a2431;
      ppvVar8 = (p->vpDivs).pArray;
      if (ppvVar8 == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
      }
    }
    (p->vpDivs).pArray = ppvVar8;
    (p->vpDivs).nCap = iVar5;
  }
LAB_007a2431:
  iVar5 = (p->vpDivs).nSize;
  (p->vpDivs).nSize = iVar5 + 1;
  (p->vpDivs).pArray[iVar5] = &p->Truth1;
  p_00 = &p->vDivs;
  (p->vDivs).nSize = 0;
  Vec_IntPush(p_00,-1);
  Vec_IntPush(p_00,-1);
  if (0 < p->nPis) {
    lVar13 = 0x10;
    lVar12 = 0;
    lVar15 = 0;
    do {
      lVar12 = lVar12 + 2;
      if ((p->vSims).nSize <= lVar12) goto LAB_007a2721;
      pvVar11 = (void *)((long)(p->vSims).pArray + lVar13);
      uVar2 = (p->vpDivs).nCap;
      if ((p->vpDivs).nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          ppvVar8 = (p->vpDivs).pArray;
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,0x80);
          }
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar2 * 2;
          if (iVar5 <= (int)uVar2) goto LAB_007a24fa;
          ppvVar8 = (p->vpDivs).pArray;
          if (ppvVar8 == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
          }
        }
        (p->vpDivs).pArray = ppvVar8;
        (p->vpDivs).nCap = iVar5;
      }
LAB_007a24fa:
      lVar14 = lVar15 + 1;
      lVar13 = lVar13 + 0x10;
      iVar5 = (p->vpDivs).nSize;
      (p->vpDivs).nSize = iVar5 + 1;
      (p->vpDivs).pArray[iVar5] = pvVar11;
      Vec_IntPush(p_00,(int)lVar15 + 1);
      lVar15 = lVar14;
    } while (lVar14 < p->nPis);
  }
  iVar5 = Gia_Rsb2ManMffc(p,iNode);
  p->nMffc = iVar5;
  if (p->nLevelIncrease < 0) {
    local_5c = 0;
  }
  else {
    iVar5 = Gia_Rsb2ManLevel(p);
    p->Level = iVar5;
    if ((p->vLevels).nSize <= iNode) {
LAB_007a2740:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    local_5c = (p->vLevels).pArray[(uint)iNode];
  }
  iVar5 = p->nPis;
  lVar15 = (long)iVar5;
  if (iVar5 + 1 < p->iFirstPo) {
    lVar12 = lVar15 + 1;
    lVar13 = lVar15 * 2;
    lVar16 = lVar15 << 4;
    lVar14 = 0;
    do {
      lVar13 = lVar13 + 2;
      lVar16 = lVar16 + 0x10;
      if (piVar3[lVar15 + lVar14 + 1] != 0) {
        iVar6 = iVar5 + (int)lVar14;
        if (-1 < p->nLevelIncrease) {
          if ((iVar6 < -1) || ((long)(p->vLevels).nSize <= lVar12 + lVar14)) goto LAB_007a2740;
          if (p->nLevelIncrease + local_5c < (p->vLevels).pArray[lVar15 + lVar14 + 1])
          goto LAB_007a26d2;
        }
        if ((iVar6 < -1) || ((p->vSims).nSize <= lVar13)) {
LAB_007a2721:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar4 = (p->vSims).pArray;
        uVar2 = (p->vpDivs).nCap;
        if ((p->vpDivs).nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            ppvVar8 = (p->vpDivs).pArray;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,0x80);
            }
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar2 * 2;
            if (iVar6 <= (int)uVar2) goto LAB_007a26a8;
            ppvVar8 = (p->vpDivs).pArray;
            if (ppvVar8 == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(ppvVar8,(ulong)uVar2 << 4);
            }
          }
          (p->vpDivs).pArray = ppvVar8;
          (p->vpDivs).nCap = iVar6;
        }
LAB_007a26a8:
        iVar6 = (p->vpDivs).nSize;
        (p->vpDivs).nSize = iVar6 + 1;
        (p->vpDivs).pArray[iVar6] = (void *)((long)pwVar4 + lVar16);
        Vec_IntPush(p_00,(int)lVar12 + (int)lVar14);
      }
LAB_007a26d2:
      lVar1 = lVar12 + lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar1 + 1 < (long)p->iFirstPo);
  }
  iVar5 = (p->vDivs).nSize;
  if (iVar5 != (p->vpDivs).nSize) {
    __assert_fail("Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x11e,"int Gia_Rsb2ManDivs(Gia_Rsb2Man_t *, int)");
  }
  return iVar5;
}

Assistant:

int Gia_Rsb2ManDivs( Gia_Rsb2Man_t * p, int iNode )
{
    int i, iNodeLevel = 0;
    int * pRefs = Vec_IntArray( &p->vRefs );
    p->CareSet = Gia_Rsb2ManOdcs( p, iNode );
    p->Truth1 = p->CareSet & Vec_WrdEntry(&p->vSims, 2*iNode);
    p->Truth0 = p->CareSet & ~p->Truth1;
    Vec_PtrClear( &p->vpDivs );
    Vec_PtrPush( &p->vpDivs, &p->Truth0 );
    Vec_PtrPush( &p->vpDivs, &p->Truth1 );
    Vec_IntClear( &p->vDivs );
    Vec_IntPushTwo( &p->vDivs, -1, -1 );
    for ( i = 1; i <= p->nPis; i++ )
    {
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    p->nMffc = Gia_Rsb2ManMffc( p, iNode );
    if ( p->nLevelIncrease >= 0 )
    {
        p->Level = Gia_Rsb2ManLevel(p);
        iNodeLevel = Vec_IntEntry(&p->vLevels, iNode);
    }
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
    {
        if ( !pRefs[i] || (p->nLevelIncrease >= 0 && Vec_IntEntry(&p->vLevels, i) > iNodeLevel + p->nLevelIncrease) )
            continue;
        Vec_PtrPush( &p->vpDivs, Vec_WrdEntryP(&p->vSims, 2*i) );
        Vec_IntPush( &p->vDivs, i );
    }
    assert( Vec_IntSize(&p->vDivs) == Vec_PtrSize(&p->vpDivs) );
    return Vec_IntSize(&p->vDivs);
}